

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ListeningReporter::testCaseStarting(ListeningReporter *this,TestCaseInfo *testInfo)

{
  bool bVar1;
  reference this_00;
  IStreamingReporter *pIVar2;
  unique_ptr<Catch::IStreamingReporter> *listener;
  iterator __end1;
  iterator __begin1;
  Reporters *__range1;
  TestCaseInfo *testInfo_local;
  ListeningReporter *this_local;
  
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
           ::begin(&this->m_listeners);
  listener = (unique_ptr<Catch::IStreamingReporter> *)
             std::
             vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
             ::end(&this->m_listeners);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>_>
                                *)&listener);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>_>
              ::operator*(&__end1);
    pIVar2 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(this_00);
    (*pIVar2->_vptr_IStreamingReporter[6])(pIVar2,testInfo);
    __gnu_cxx::
    __normal_iterator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>_>
    ::operator++(&__end1);
  }
  pIVar2 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*pIVar2->_vptr_IStreamingReporter[6])(pIVar2,testInfo);
  return;
}

Assistant:

void ListeningReporter::testCaseStarting(TestCaseInfo const &testInfo) {
        for (auto const &listener : m_listeners) {
            listener->testCaseStarting(testInfo);
        }
        m_reporter->testCaseStarting(testInfo);
    }